

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameData.cpp
# Opt level: O2

void __thiscall GameData::InitNewGame(GameData *this)

{
  char cVar1;
  int iVar2;
  int (*paiVar3) [4];
  int i;
  long lVar4;
  int j;
  long lVar5;
  ifstream TempFile;
  
  iVar2 = this->score;
  if (this->score < this->local_best) {
    iVar2 = this->local_best;
  }
  this->local_best = iVar2;
  paiVar3 = this->num;
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      (*paiVar3)[lVar5] = 0;
    }
    paiVar3 = paiVar3 + 1;
  }
  MakeNewNumber(this);
  MakeNewNumber(this);
  std::ifstream::ifstream(&TempFile,"2048GAME.data",_S_in|_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::istream::operator>>((istream *)&TempFile,&this->my_best);
  }
  std::ifstream::close();
  this->score = 0;
  std::ifstream::~ifstream(&TempFile);
  return;
}

Assistant:

void GameData::InitNewGame() {
    local_best = std::max(local_best, score);
    for (int i = 0; i < 4; i++)
        for (int j = 0; j < 4; j++)
            num[i][j] = 0;
    MakeNewNumber();
    MakeNewNumber();
    std::ifstream TempFile("2048GAME.data",std::ios::in | std::ios::binary);
    if(TempFile.is_open())
        TempFile>>my_best;
    TempFile.close();
    score = 0;
}